

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Quat<double> * Imath_2_5::extractQuat<double>(Matrix44<double> *mat)

{
  double dVar1;
  double *pdVar2;
  Matrix44<double> *in_RSI;
  Quat<double> *in_RDI;
  int nxt [3];
  int k;
  int j;
  int i;
  double q [4];
  double s;
  double tr;
  Matrix44<double> rot;
  Quat<double> *quat;
  Matrix44<double> *in_stack_fffffffffffffeb0;
  double dVar3;
  int local_e0 [4];
  int local_d0;
  int local_cc;
  double local_c8 [5];
  double local_a0;
  double local_98;
  Matrix44<double> *local_10;
  
  local_10 = in_RSI;
  Matrix44<double>::Matrix44(in_stack_fffffffffffffeb0);
  Quat<double>::Quat((Quat<double> *)0x1843db);
  local_e0[0] = 1;
  local_e0[1] = 2;
  local_e0[2] = 0;
  pdVar2 = Matrix44<double>::operator[](local_10,0);
  dVar3 = *pdVar2;
  pdVar2 = Matrix44<double>::operator[](local_10,1);
  dVar1 = pdVar2[1];
  pdVar2 = Matrix44<double>::operator[](local_10,2);
  local_98 = dVar3 + dVar1 + pdVar2[2];
  if (local_98 <= 0.0) {
    local_cc = 0;
    pdVar2 = Matrix44<double>::operator[](local_10,1);
    dVar3 = pdVar2[1];
    pdVar2 = Matrix44<double>::operator[](local_10,0);
    if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
      local_cc = 1;
    }
    pdVar2 = Matrix44<double>::operator[](local_10,2);
    dVar3 = pdVar2[2];
    pdVar2 = Matrix44<double>::operator[](local_10,local_cc);
    if (pdVar2[local_cc] <= dVar3 && dVar3 != pdVar2[local_cc]) {
      local_cc = 2;
    }
    local_d0 = local_e0[local_cc];
    local_e0[3] = local_e0[local_e0[local_cc]];
    pdVar2 = Matrix44<double>::operator[](local_10,local_cc);
    dVar3 = pdVar2[local_cc];
    pdVar2 = Matrix44<double>::operator[](local_10,local_d0);
    dVar1 = pdVar2[local_d0];
    pdVar2 = Matrix44<double>::operator[](local_10,local_e0[3]);
    local_a0 = Math<double>::sqrt((dVar3 - (dVar1 + pdVar2[local_e0[3]])) + 1.0);
    local_c8[local_cc] = local_a0 * 0.5;
    if ((local_a0 != 0.0) || (NAN(local_a0))) {
      local_a0 = 0.5 / local_a0;
    }
    pdVar2 = Matrix44<double>::operator[](local_10,local_d0);
    dVar3 = pdVar2[local_e0[3]];
    pdVar2 = Matrix44<double>::operator[](local_10,local_e0[3]);
    local_c8[3] = (dVar3 - pdVar2[local_d0]) * local_a0;
    pdVar2 = Matrix44<double>::operator[](local_10,local_cc);
    dVar3 = pdVar2[local_d0];
    pdVar2 = Matrix44<double>::operator[](local_10,local_d0);
    local_c8[local_d0] = (dVar3 + pdVar2[local_cc]) * local_a0;
    pdVar2 = Matrix44<double>::operator[](local_10,local_cc);
    dVar3 = pdVar2[local_e0[3]];
    pdVar2 = Matrix44<double>::operator[](local_10,local_e0[3]);
    local_c8[local_e0[3]] = (dVar3 + pdVar2[local_cc]) * local_a0;
    (in_RDI->v).x = local_c8[0];
    (in_RDI->v).y = local_c8[1];
    (in_RDI->v).z = local_c8[2];
    in_RDI->r = local_c8[3];
  }
  else {
    local_a0 = Math<double>::sqrt(local_98 + 1.0);
    in_RDI->r = local_a0 / 2.0;
    local_a0 = 0.5 / local_a0;
    pdVar2 = Matrix44<double>::operator[](local_10,1);
    dVar3 = pdVar2[2];
    pdVar2 = Matrix44<double>::operator[](local_10,2);
    (in_RDI->v).x = (dVar3 - pdVar2[1]) * local_a0;
    pdVar2 = Matrix44<double>::operator[](local_10,2);
    dVar3 = *pdVar2;
    pdVar2 = Matrix44<double>::operator[](local_10,0);
    (in_RDI->v).y = (dVar3 - pdVar2[2]) * local_a0;
    pdVar2 = Matrix44<double>::operator[](local_10,0);
    dVar3 = pdVar2[1];
    pdVar2 = Matrix44<double>::operator[](local_10,1);
    (in_RDI->v).z = (dVar3 - *pdVar2) * local_a0;
  }
  return in_RDI;
}

Assistant:

Quat<T>
extractQuat (const Matrix44<T> &mat)
{
  Matrix44<T> rot;

  T        tr, s;
  T         q[4];
  int    i, j, k;
  Quat<T>   quat;

  int nxt[3] = {1, 2, 0};
  tr = mat[0][0] + mat[1][1] + mat[2][2];

  // check the diagonal
  if (tr > 0.0) {
     s = Math<T>::sqrt (tr + T(1.0));
     quat.r = s / T(2.0);
     s = T(0.5) / s;

     quat.v.x = (mat[1][2] - mat[2][1]) * s;
     quat.v.y = (mat[2][0] - mat[0][2]) * s;
     quat.v.z = (mat[0][1] - mat[1][0]) * s;
  } 
  else {      
     // diagonal is negative
     i = 0;
     if (mat[1][1] > mat[0][0]) 
        i=1;
     if (mat[2][2] > mat[i][i]) 
        i=2;
    
     j = nxt[i];
     k = nxt[j];
     s = Math<T>::sqrt ((mat[i][i] - (mat[j][j] + mat[k][k])) + T(1.0));
      
     q[i] = s * T(0.5);
     if (s != T(0.0)) 
        s = T(0.5) / s;

     q[3] = (mat[j][k] - mat[k][j]) * s;
     q[j] = (mat[i][j] + mat[j][i]) * s;
     q[k] = (mat[i][k] + mat[k][i]) * s;

     quat.v.x = q[0];
     quat.v.y = q[1];
     quat.v.z = q[2];
     quat.r = q[3];
 }

  return quat;
}